

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

void __thiscall
jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>::~algo
          (algo<jwt::algorithm::rs256> *this)

{
  ~algo(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual void verify(const std::string& data, const std::string& sig) override {
				alg.verify(data, sig);
			}